

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O2

lua_State * lua_newstate(lua_Alloc f,void *ud)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  time_t tVar4;
  size_t t;
  lua_State *L;
  long lVar5;
  uint local_4c;
  char buff [32];
  
  L = (lua_State *)0x0;
  pvVar3 = (*f)(ud,(void *)0x0,8,0x670);
  if (pvVar3 != (void *)0x0) {
    L = (lua_State *)((long)pvVar3 + 0x10);
    *(code **)((long)pvVar3 + 0x650) = raviE_default_writeline;
    *(code **)((long)pvVar3 + 0x658) = raviE_default_writestring;
    *(code **)((long)pvVar3 + 0x660) = raviE_default_writestringerror;
    *(undefined8 *)((long)pvVar3 + 0x668) = 0;
    *(undefined8 *)((long)pvVar3 + 0x10) = 0;
    *(undefined2 *)((long)pvVar3 + 0x18) = 0x808;
    *(undefined1 *)((long)pvVar3 + 0x134) = 8;
    preinit_thread(L,(global_State *)((long)pvVar3 + 0xe0));
    if (9 < (*(byte *)((long)pvVar3 + 0x18) & 0xe)) {
      __assert_fail("(((L)->tt) & 0x0F) < (9+1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lstate.c"
                    ,0x17d,"lua_State *lua_newstate(lua_Alloc, void *)");
    }
    *(lua_State **)((long)pvVar3 + 0x140) = L;
    *(undefined8 *)((long)pvVar3 + 0x10) = 0;
    *(lua_Alloc *)((long)pvVar3 + 0xe0) = f;
    *(void **)((long)pvVar3 + 0xe8) = ud;
    *(lua_State **)((long)pvVar3 + 0x1d8) = L;
    tVar4 = time((time_t *)0x0);
    buff._8_8_ = &local_4c;
    local_4c = (uint)tVar4;
    buff._16_8_ = &luaO_nilobject_;
    buff._24_8_ = lua_newstate;
    buff._0_8_ = L;
    uVar1 = luaS_hash(buff,0x20,local_4c);
    *(uint *)((long)pvVar3 + 0x130) = uVar1;
    *(undefined2 *)((long)pvVar3 + 0x128) = 0;
    *(undefined8 *)((long)pvVar3 + 0x1e0) = 0;
    *(undefined8 *)((long)pvVar3 + 0x110) = 0;
    *(undefined8 *)((long)pvVar3 + 0x118) = 0;
    *(undefined4 *)((long)pvVar3 + 0x135) = 0x14000008;
    *(undefined1 *)((long)pvVar3 + 0x13b) = 0;
    *(undefined8 *)((long)pvVar3 + 0x148) = 0;
    *(undefined8 *)((long)pvVar3 + 0x150) = 0;
    *(undefined8 *)((long)pvVar3 + 0x158) = 0;
    *(undefined8 *)((long)pvVar3 + 0x160) = 0;
    *(undefined8 *)((long)pvVar3 + 0x168) = 0;
    *(undefined8 *)((long)pvVar3 + 0x170) = 0;
    *(undefined8 *)((long)pvVar3 + 0x178) = 0;
    *(undefined8 *)((long)pvVar3 + 0x180) = 0;
    *(undefined8 *)((long)pvVar3 + 0x188) = 0;
    *(undefined8 *)((long)pvVar3 + 400) = 0;
    *(undefined8 *)((long)pvVar3 + 0x198) = 0;
    *(undefined8 *)((long)pvVar3 + 0x1a0) = 0;
    *(undefined8 *)((long)pvVar3 + 0x1a8) = 0;
    *(undefined8 *)((long)pvVar3 + 0x1b0) = 0;
    *(undefined8 *)((long)pvVar3 + 0x1b8) = 0;
    *(undefined8 *)((long)pvVar3 + 0x1c0) = 0;
    *(undefined8 *)((long)pvVar3 + 0x1c8) = 0;
    *(undefined8 *)((long)pvVar3 + 0x1d0) = 0;
    *(undefined8 *)((long)pvVar3 + 0xf0) = 0x670;
    *(undefined8 *)((long)pvVar3 + 0xf8) = 0;
    *(undefined8 *)((long)pvVar3 + 0x108) = 0;
    *(undefined2 *)((long)pvVar3 + 0x13c) = 0x1932;
    *(undefined1 *)((long)pvVar3 + 0x13e) = 0xd;
    *(undefined2 *)((long)pvVar3 + 0x139) = 0x219;
    for (lVar5 = 0; lVar5 != 9; lVar5 = lVar5 + 1) {
      *(undefined8 *)((long)pvVar3 + lVar5 * 8 + 0x2b0) = 0;
    }
    *(undefined8 *)((long)pvVar3 + 0x648) = 0;
    raviV_initjit(L);
    iVar2 = luaD_rawrunprotected(L,f_luaopen,(void *)0x0);
    if (iVar2 != 0) {
      close_state(L);
      L = (lua_State *)0x0;
    }
  }
  return L;
}

Assistant:

LUA_API lua_State *lua_newstate (lua_Alloc f, void *ud) {
  int i;
  lua_State *L;
  global_State *g;

  LG *l = cast(LG *, (*f)(ud, NULL, LUA_TTHREAD, sizeof(LG)));
  if (l == NULL) return NULL;
  L = &l->l.l;
  g = &l->g;
  g->ravi_writeline = raviE_default_writeline;
  g->ravi_writestring = raviE_default_writestring;
  g->ravi_writestringerror = raviE_default_writestringerror;
  g->ravi_debugger_data = NULL;
  L->next = NULL;
  L->tt = LUA_TTHREAD;
  g->currentwhite = bitmask(WHITE0BIT);
  L->marked = luaC_white(g);
  preinit_thread(L, g);
  g->allgc = obj2gco(L);  /* by now, only object is the main thread */
  L->next = NULL;
  g->frealloc = f;
  g->ud = ud;
  g->mainthread = L;
  g->seed = makeseed(L);
  g->gcstp = GCSTPGC;  /* no GC while building state */
  g->strt.size = g->strt.nuse = 0;
  g->strt.hash = NULL;
  setnilvalue(&g->l_registry);
  g->panic = NULL;
  g->version = NULL;
  g->gcstate = GCSpause;
  g->gckind = KGC_INC;
  g->gcstopem = 0;
  g->gcemergency = 0;
  g->finobj = g->tobefnz = g->fixedgc = NULL;
  g->firstold1 = g->survival = g->old1 = g->reallyold = NULL;
  g->finobjsur = g->finobjold1 = g->finobjrold = NULL;
  g->sweepgc = NULL;
  g->gray = g->grayagain = NULL;
  g->weak = g->ephemeron = g->allweak = NULL;
  g->twups = NULL;
  g->totalbytes = sizeof(LG);
  g->GCdebt = 0;
  g->lastatomic = 0;
  setgcparam(g->gcpause, LUAI_GCPAUSE);
  setgcparam(g->gcstepmul, LUAI_GCMUL);
  g->gcstepsize = LUAI_GCSTEPSIZE;
  setgcparam(g->genmajormul, LUAI_GENMAJORMUL);
  g->genminormul = LUAI_GENMINORMUL;
  for (i=0; i < LUA_NUMTAGS; i++) g->mt[i] = NULL;
  g->ravi_state = NULL;
  raviV_initjit(L);
  if (luaD_rawrunprotected(L, f_luaopen, NULL) != LUA_OK) {
    /* memory allocation error: free partial state */
    close_state(L);
    L = NULL;
  }
#if RAVI_BYTECODE_PROFILING_ENABLED
  raviV_init_profiledata(L);
#endif
  return L;
}